

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

Logger * el::Loggers::reconfigureLogger
                   (string *identity,ConfigurationType configurationType,string *value)

{
  Configurations *this;
  Logger *logger;
  string *value_local;
  ConfigurationType configurationType_local;
  string *identity_local;
  
  identity_local = (string *)getLogger(identity,true);
  if ((Logger *)identity_local == (Logger *)0x0) {
    identity_local = (string *)0x0;
  }
  else {
    this = Logger::configurations((Logger *)identity_local);
    Configurations::set(this,Global,configurationType,value);
    Logger::reconfigure((Logger *)identity_local);
  }
  return (Logger *)identity_local;
}

Assistant:

Logger* Loggers::reconfigureLogger(const std::string& identity, ConfigurationType configurationType,
                                   const std::string& value) {
  Logger* logger = Loggers::getLogger(identity);
  if (logger == nullptr) {
    return nullptr;
  }
  logger->configurations()->set(Level::Global, configurationType, value);
  logger->reconfigure();
  return logger;
}